

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Options * leveldb::SanitizeOptions
                    (string *dbname,InternalKeyComparator *icmp,InternalFilterPolicy *ipolicy,
                    Options *src)

{
  long *plVar1;
  bool bVar2;
  Cache *pCVar3;
  FilterPolicy *in_RCX;
  Comparator *in_RDX;
  undefined8 in_RSI;
  Options *in_RDI;
  void *in_R8;
  Options *result;
  Status s;
  string *in_stack_ffffffffffffff38;
  Status *in_stack_ffffffffffffff40;
  FilterPolicy *local_b0;
  string local_98 [32];
  Status local_78;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  void *local_20;
  FilterPolicy *local_18;
  Comparator *local_10;
  undefined8 local_8;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memcpy(in_RDI,in_R8,0x860);
  in_RDI->comparator = local_10;
  if (*(long *)((long)local_20 + 0x858) == 0) {
    local_b0 = (FilterPolicy *)0x0;
  }
  else {
    local_b0 = local_18;
  }
  in_RDI->filter_policy = local_b0;
  ClipToRange<int,int>(&in_RDI->max_open_files,0x4a,50000);
  ClipToRange<unsigned_long,int>(&in_RDI->write_buffer_size,0x10000,0x40000000);
  ClipToRange<unsigned_long,int>(&in_RDI->max_file_size,0x100000,0x40000000);
  ClipToRange<unsigned_long,int>(&in_RDI->block_size,0x400,0x400000);
  if (in_RDI->info_log == (Logger *)0x0) {
    (**(code **)(**(long **)((long)local_20 + 0x10) + 0x48))
              (local_28,*(long **)((long)local_20 + 0x10),local_8);
    Status::~Status(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff40 = *(Status **)((long)local_20 + 0x10);
    InfoLogFileName(in_stack_ffffffffffffff38);
    OldInfoLogFileName(in_stack_ffffffffffffff38);
    (**(code **)(in_stack_ffffffffffffff40->state_ + 0x60))
              (local_30,in_stack_ffffffffffffff40,local_50,local_70);
    Status::~Status(in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    plVar1 = *(long **)((long)local_20 + 0x10);
    InfoLogFileName(in_stack_ffffffffffffff38);
    (**(code **)(*plVar1 + 0x90))(&local_78,plVar1,local_98,&in_RDI->info_log);
    std::__cxx11::string::~string(local_98);
    bVar2 = Status::ok(&local_78);
    if (!bVar2) {
      in_RDI->info_log = (Logger *)0x0;
    }
    Status::~Status(in_stack_ffffffffffffff40);
  }
  if (in_RDI->block_cache == (Cache *)0x0) {
    pCVar3 = NewLRUCache((size_t)in_stack_ffffffffffffff40);
    in_RDI->block_cache = pCVar3;
  }
  return in_RDI;
}

Assistant:

Options SanitizeOptions(const std::string& dbname,
                        const InternalKeyComparator* icmp,
                        const InternalFilterPolicy* ipolicy,
                        const Options& src) {
  Options result = src;
  result.comparator = icmp;
  result.filter_policy = (src.filter_policy != nullptr) ? ipolicy : nullptr;
  ClipToRange(&result.max_open_files, 64 + kNumNonTableCacheFiles, 50000);
  ClipToRange(&result.write_buffer_size, 64 << 10, 1 << 30);
  ClipToRange(&result.max_file_size, 1 << 20, 1 << 30);
  ClipToRange(&result.block_size, 1 << 10, 4 << 20);
  if (result.info_log == nullptr) {
    // Open a log file in the same directory as the db
    src.env->CreateDir(dbname);  // In case it does not exist
    src.env->RenameFile(InfoLogFileName(dbname), OldInfoLogFileName(dbname));
    Status s = src.env->NewLogger(InfoLogFileName(dbname), &result.info_log);
    if (!s.ok()) {
      // No place suitable for logging
      result.info_log = nullptr;
    }
  }
  if (result.block_cache == nullptr) {
    result.block_cache = NewLRUCache(8 << 20);
  }
  return result;
}